

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasmtool.c
# Opt level: O0

char * exception_type_to_string(ND_EX_TYPE ExType)

{
  char *pcStack_10;
  ND_EX_TYPE ExType_local;
  
  switch(ExType) {
  case ND_EXT_1:
    pcStack_10 = "1";
    break;
  case ND_EXT_2:
    pcStack_10 = "2";
    break;
  case ND_EXT_3:
    pcStack_10 = "3";
    break;
  case ND_EXT_4:
    pcStack_10 = "4";
    break;
  case ND_EXT_5:
    pcStack_10 = "5";
    break;
  case ND_EXT_6:
    pcStack_10 = "6";
    break;
  case ND_EXT_7:
    pcStack_10 = "7";
    break;
  case ND_EXT_8:
    pcStack_10 = "8";
    break;
  case ND_EXT_9:
    pcStack_10 = "9";
    break;
  case ND_EXT_10:
    pcStack_10 = "10";
    break;
  case ND_EXT_11:
    pcStack_10 = "11";
    break;
  case ND_EXT_12:
    pcStack_10 = "12";
    break;
  case ND_EXT_13:
    pcStack_10 = "13";
    break;
  case ND_EXT_14:
    pcStack_10 = "14";
    break;
  case ND_EXT_K20:
    pcStack_10 = "K20";
    break;
  case ND_EXT_K21:
    pcStack_10 = "K21";
    break;
  case ND_EXT_E1:
    pcStack_10 = "E1";
    break;
  case ND_EXT_E1NF:
    pcStack_10 = "E1NF";
    break;
  case ND_EXT_E2:
    pcStack_10 = "E2";
    break;
  case ND_EXT_E3:
    pcStack_10 = "E3";
    break;
  case ND_EXT_E3NF:
    pcStack_10 = "E3NF";
    break;
  case ND_EXT_E4:
    pcStack_10 = "E4";
    break;
  default:
    pcStack_10 = "None";
    break;
  case ND_EXT_E4nb:
    pcStack_10 = "E4.nb";
    break;
  case ND_EXT_E4NF:
    pcStack_10 = "E4NF";
    break;
  case ND_EXT_E4NFnb:
    pcStack_10 = "E4NF.nb";
    break;
  case ND_EXT_E5:
    pcStack_10 = "E5";
    break;
  case ND_EXT_E5NF:
    pcStack_10 = "E5NF";
    break;
  case ND_EXT_E6:
    pcStack_10 = "E6";
    break;
  case ND_EXT_E6NF:
    pcStack_10 = "E6NF";
    break;
  case ND_EXT_E7NM:
    pcStack_10 = "E7NM";
    break;
  case ND_EXT_E9:
    pcStack_10 = "E9";
    break;
  case ND_EXT_E9NF:
    pcStack_10 = "E9NF";
    break;
  case ND_EXT_E10:
    pcStack_10 = "E10";
    break;
  case ND_EXT_E10NF:
    pcStack_10 = "E10NF";
    break;
  case ND_EXT_E11:
    pcStack_10 = "E11";
    break;
  case ND_EXT_E12:
    pcStack_10 = "E12";
    break;
  case ND_EXT_E12NP:
    pcStack_10 = "E12NP";
    break;
  case ND_EXT_AMX_E1:
    pcStack_10 = "AMX-E1";
    break;
  case ND_EXT_AMX_E2:
    pcStack_10 = "AMX-E2";
    break;
  case ND_EXT_AMX_E3:
    pcStack_10 = "AMX-E3";
    break;
  case ND_EXT_AMX_E4:
    pcStack_10 = "AMX-E4";
    break;
  case ND_EXT_AMX_E5:
    pcStack_10 = "AMX-E5";
    break;
  case ND_EXT_AMX_E6:
    pcStack_10 = "AMX-E6";
    break;
  case ND_EXT_AMX_E7:
    pcStack_10 = "AMX-E7";
    break;
  case ND_EXT_AMX_E8:
    pcStack_10 = "AMX-E8";
    break;
  case ND_EXT_AMX_E9:
    pcStack_10 = "AMX-E9";
    break;
  case ND_EXT_AMX_E10:
    pcStack_10 = "AMX-E10";
    break;
  case ND_EXT_AMX_E11:
    pcStack_10 = "AMX-E11";
    break;
  case ND_EXT_AMX_EVEX_E1:
    pcStack_10 = "AMX-EVEX-E1";
    break;
  case ND_EXT_AMX_EVEX_E2:
    pcStack_10 = "AMX-EVEX-E2";
    break;
  case ND_EXT_AMX_EVEX_E3:
    pcStack_10 = "AMX-EVEX-E3";
    break;
  case ND_EXT_AMX_EVEX_E4:
    pcStack_10 = "AMX-EVEX-E4";
    break;
  case ND_EXT_AMX_EVEX_E5:
    pcStack_10 = "AMX-EVEX-E5";
    break;
  case ND_EXT_AMX_EVEX_E6:
    pcStack_10 = "AMX-EVEX-E6";
    break;
  case ND_EXT_AMX_EVEX_E7:
    pcStack_10 = "AMX-EVEX-E7";
    break;
  case ND_EXT_AMX_EVEX_E8:
    pcStack_10 = "AMX-EVEX-E8";
    break;
  case ND_EXT_APX_EVEX_BMI:
    pcStack_10 = "APX-EVEX-BMI";
    break;
  case ND_EXT_APX_EVEX_CCMP:
    pcStack_10 = "APX-EVEX-CCMP";
    break;
  case ND_EXT_APX_EVEX_WRSS:
    pcStack_10 = "APX-EVEX-WRSS";
    break;
  case ND_EXT_APX_EVEX_WRUSS:
    pcStack_10 = "APX-EVEX-WRUSS";
    break;
  case ND_EXT_APX_EVEX_CFCMOV:
    pcStack_10 = "APX-EVEX-CFCMOV";
    break;
  case ND_EXT_APX_EVEX_CMPCCXADD:
    pcStack_10 = "APX-EVEX-CMPCCXADD";
    break;
  case ND_EXT_APX_EVEX_ENQCMD:
    pcStack_10 = "APX-EVEX-ENQCMD";
    break;
  case ND_EXT_APX_EVEX_INT:
    pcStack_10 = "APX-EVEX-INT";
    break;
  case ND_EXT_APX_EVEX_INVEPT:
    pcStack_10 = "APX-EVEX-INVEPT";
    break;
  case ND_EXT_APX_EVEX_INVPCID:
    pcStack_10 = "APX-EVEX-INVPCID";
    break;
  case ND_EXT_APX_EVEX_INVVPID:
    pcStack_10 = "APX-EVEX-INVVPID";
    break;
  case ND_EXT_APX_EVEX_KEYLOCKER:
    pcStack_10 = "APX-EVEX-KEYLOCKER";
    break;
  case ND_EXT_APX_EVEX_KMOV:
    pcStack_10 = "APX-EVEX-KMOV";
    break;
  case ND_EXT_APX_EVEX_PP2:
    pcStack_10 = "APX-EVEX-PP2";
    break;
  case ND_EXT_APX_EVEX_RAOINT:
    pcStack_10 = "APX-EVEX-RAO-INT";
    break;
  case ND_EXT_APX_EVEX_SHA:
    pcStack_10 = "APX-EVEX-SHA";
    break;
  case ND_EXT_APX_EVEX_USER_MSR:
    pcStack_10 = "APX-EVEX-USER-MSR";
  }
  return pcStack_10;
}

Assistant:

const char*
exception_type_to_string(
    _In_ ND_EX_TYPE ExType
    )
{
    switch (ExType)
    {
    case ND_EXT_1: return "1";
    case ND_EXT_2: return "2";
    case ND_EXT_3: return "3";
    case ND_EXT_4: return "4";
    case ND_EXT_5: return "5";
    case ND_EXT_6: return "6";
    case ND_EXT_7: return "7";
    case ND_EXT_8: return "8";
    case ND_EXT_9: return "9";
    case ND_EXT_10: return "10";
    case ND_EXT_11: return "11";
    case ND_EXT_12: return "12";
    case ND_EXT_13: return "13";
    case ND_EXT_14: return "14";

    case ND_EXT_K20: return "K20";
    case ND_EXT_K21: return "K21";

    case ND_EXT_E1: return "E1";
    case ND_EXT_E1NF: return "E1NF";
    case ND_EXT_E2: return "E2";
    case ND_EXT_E3: return "E3";
    case ND_EXT_E3NF: return "E3NF";
    case ND_EXT_E4: return "E4";
    case ND_EXT_E4nb: return "E4.nb";
    case ND_EXT_E4NF: return "E4NF";
    case ND_EXT_E4NFnb: return "E4NF.nb";
    case ND_EXT_E5: return "E5";
    case ND_EXT_E5NF: return "E5NF";
    case ND_EXT_E6: return "E6";
    case ND_EXT_E6NF: return "E6NF";
    case ND_EXT_E7NM: return "E7NM";
    case ND_EXT_E9: return "E9";
    case ND_EXT_E9NF: return "E9NF";
    case ND_EXT_E10: return "E10";
    case ND_EXT_E10NF: return "E10NF";
    case ND_EXT_E11: return "E11";
    case ND_EXT_E12: return "E12";
    case ND_EXT_E12NP: return "E12NP";

    case ND_EXT_AMX_E1: return "AMX-E1";
    case ND_EXT_AMX_E2: return "AMX-E2";
    case ND_EXT_AMX_E3: return "AMX-E3";
    case ND_EXT_AMX_E4: return "AMX-E4";
    case ND_EXT_AMX_E5: return "AMX-E5";
    case ND_EXT_AMX_E6: return "AMX-E6";
    case ND_EXT_AMX_E7: return "AMX-E7";
    case ND_EXT_AMX_E8: return "AMX-E8";
    case ND_EXT_AMX_E9: return "AMX-E9";
    case ND_EXT_AMX_E10: return "AMX-E10";
    case ND_EXT_AMX_E11: return "AMX-E11";

    case ND_EXT_AMX_EVEX_E1: return "AMX-EVEX-E1";
    case ND_EXT_AMX_EVEX_E2: return "AMX-EVEX-E2";
    case ND_EXT_AMX_EVEX_E3: return "AMX-EVEX-E3";
    case ND_EXT_AMX_EVEX_E4: return "AMX-EVEX-E4";
    case ND_EXT_AMX_EVEX_E5: return "AMX-EVEX-E5";
    case ND_EXT_AMX_EVEX_E6: return "AMX-EVEX-E6";
    case ND_EXT_AMX_EVEX_E7: return "AMX-EVEX-E7";
    case ND_EXT_AMX_EVEX_E8: return "AMX-EVEX-E8";

    case ND_EXT_APX_EVEX_BMI: return "APX-EVEX-BMI";
    case ND_EXT_APX_EVEX_CCMP: return "APX-EVEX-CCMP";
    case ND_EXT_APX_EVEX_WRSS: return "APX-EVEX-WRSS";
    case ND_EXT_APX_EVEX_WRUSS: return "APX-EVEX-WRUSS";
    case ND_EXT_APX_EVEX_CFCMOV: return "APX-EVEX-CFCMOV";
    case ND_EXT_APX_EVEX_CMPCCXADD: return "APX-EVEX-CMPCCXADD";
    case ND_EXT_APX_EVEX_ENQCMD: return "APX-EVEX-ENQCMD";
    case ND_EXT_APX_EVEX_INT: return "APX-EVEX-INT";
    case ND_EXT_APX_EVEX_INVEPT: return "APX-EVEX-INVEPT";
    case ND_EXT_APX_EVEX_INVPCID: return "APX-EVEX-INVPCID";
    case ND_EXT_APX_EVEX_INVVPID: return "APX-EVEX-INVVPID";
    case ND_EXT_APX_EVEX_KEYLOCKER: return "APX-EVEX-KEYLOCKER";
    case ND_EXT_APX_EVEX_KMOV: return "APX-EVEX-KMOV";
    case ND_EXT_APX_EVEX_PP2: return "APX-EVEX-PP2";
    case ND_EXT_APX_EVEX_SHA: return "APX-EVEX-SHA";
    case ND_EXT_APX_EVEX_RAOINT: return "APX-EVEX-RAO-INT";
    case ND_EXT_APX_EVEX_USER_MSR: return "APX-EVEX-USER-MSR";

    default: return "None";
    }
}